

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_copy.c
# Opt level: O0

void test_copy(void)

{
  undefined8 in_RAX;
  char *unaff_retaddr;
  
  assertion_umask(unaff_retaddr,(wchar_t)((ulong)in_RAX >> 0x20),(wchar_t)in_RAX);
  create_tree();
  copy_basic();
  copy_ustar();
  return;
}

Assistant:

DEFINE_TEST(test_copy)
{
	assertUmask(0);
	create_tree(); /* Create sample files in "original" dir. */

	/* Test simple "tar -c | tar -x" pipeline copy. */
	copy_basic();

	/* Same, but constrain to ustar format. */
	copy_ustar();
}